

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_index.cpp
# Opt level: O3

IndexStorageInfo * __thiscall
duckdb::BoundIndex::GetStorageInfo
          (IndexStorageInfo *__return_storage_ptr__,BoundIndex *this,
          case_insensitive_map_t<Value> *options,bool to_wal)

{
  NotImplementedException *this_00;
  string local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"The implementation of this index serialization does not exist.",""
            );
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

IndexStorageInfo BoundIndex::GetStorageInfo(const case_insensitive_map_t<Value> &options, const bool to_wal) {
	throw NotImplementedException("The implementation of this index serialization does not exist.");
}